

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O2

void __thiscall QVariantAnimationPrivate::convertValues(QVariantAnimationPrivate *this,int t)

{
  long lVar1;
  pointer ppVar2;
  int i;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QMetaType type;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  type.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  QMetaType::QMetaType(&type,t);
  lVar4 = 8;
  for (uVar3 = 0; uVar3 < (ulong)(this->keyValues).d.size; uVar3 = uVar3 + 1) {
    ppVar2 = QList<std::pair<double,_QVariant>_>::data(&this->keyValues);
    ::QVariant::convert((QVariant *)((long)&ppVar2->first + lVar4),type);
    lVar4 = lVar4 + 0x28;
  }
  ::QVariant::convert(&(this->currentInterval).start.second,type);
  ::QVariant::convert(&(this->currentInterval).end.second,type);
  updateInterpolator(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimationPrivate::convertValues(int t)
{
    auto type = QMetaType(t);
    //this ensures that all the keyValues are of type t
    for (int i = 0; i < keyValues.size(); ++i) {
        QVariantAnimation::KeyValue &pair = keyValues[i];
        pair.second.convert(type);
    }
    //we also need update to the current interval if needed
    currentInterval.start.second.convert(type);
    currentInterval.end.second.convert(type);

    //... and the interpolator
    updateInterpolator();
}